

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.h
# Opt level: O2

Ptr __thiscall core::image::rescale_double_size_supersample<float>(image *this,ConstPtr *img)

{
  uint uVar1;
  int iVar2;
  uint chans;
  int iVar3;
  element_type *peVar4;
  pointer pfVar5;
  long lVar6;
  uint width;
  uint height;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  uint uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  Ptr PVar15;
  
  peVar4 = (img->super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  iVar2 = (peVar4->super_TypedImageBase<float>).super_ImageBase.w;
  chans = (peVar4->super_TypedImageBase<float>).super_ImageBase.c;
  width = iVar2 * 2;
  height = (peVar4->super_TypedImageBase<float>).super_ImageBase.h * 2;
  Image<float>::create();
  TypedImageBase<float>::allocate(*(TypedImageBase<float> **)this,width,height,chans);
  if ((int)chans < 1) {
    chans = 0;
  }
  uVar7 = 0;
  if (0 < (int)width) {
    uVar7 = width;
  }
  uVar8 = 0;
  if (0 < (int)height) {
    uVar8 = height;
  }
  _Var10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar11 = 0;
  while (uVar11 != uVar8) {
    iVar12 = (uVar11 >> 1) * iVar2;
    uVar1 = uVar11 + 1;
    iVar13 = (((int)uVar1 < (int)height) + uVar11 >> 1) * iVar2;
    uVar9 = 0;
    while( true ) {
      uVar11 = uVar1;
      if (uVar9 == uVar7) break;
      peVar4 = (img->super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      iVar3 = (peVar4->super_TypedImageBase<float>).super_ImageBase.c;
      pfVar5 = (peVar4->super_TypedImageBase<float>).data.
               super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
               _M_start;
      lVar6 = *(long *)this;
      uVar11 = ((int)(uVar9 + 1) < (int)width) + uVar9 >> 1;
      for (uVar14 = 0; chans != uVar14; uVar14 = uVar14 + 1) {
        *(float *)(*(long *)(lVar6 + 0x18) + (long)(int)_Var10._M_pi * 4 + uVar14 * 4) =
             pfVar5[(long)(int)((iVar13 + uVar11) * iVar3) + uVar14] * 0.25 +
             pfVar5[(long)(int)((iVar13 + (uVar9 >> 1)) * iVar3) + uVar14] * 0.25 +
             pfVar5[(long)(int)(((uVar9 >> 1) + iVar12) * iVar3) + uVar14] * 0.25 +
             pfVar5[(long)(int)((uVar11 + iVar12) * iVar3) + uVar14] * 0.25;
      }
      _Var10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     (ulong)(uint)((int)_Var10._M_pi + (int)uVar14);
      uVar9 = uVar9 + 1;
    }
  }
  PVar15.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var10._M_pi;
  PVar15.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar15.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

typename Image<T>::Ptr
rescale_double_size_supersample (typename Image<T>::ConstPtr img)
{
    int const iw = img->width();
    int const ih = img->height();
    int const ic = img->channels();
    int const ow = iw << 1;
    int const oh = ih << 1;

    typename Image<T>::Ptr out(Image<T>::create());
    out->allocate(ow, oh, ic);

    int witer = 0;
    for (int y = 0; y < oh; ++y)
    {
        bool nexty = (y + 1 < oh);
        int yoff[2] = { iw * (y >> 1), iw * ((y + nexty) >> 1) };
        for (int x = 0; x < ow; ++x)
        {
            bool nextx = (x + 1 < ow);
            int xoff[2] = { x >> 1, (x + nextx) >> 1 };
            T const* val[4] =
            {
                &img->at(yoff[0] + xoff[0], 0),
                &img->at(yoff[0] + xoff[1], 0),
                &img->at(yoff[1] + xoff[0], 0),
                &img->at(yoff[1] + xoff[1], 0)
            };

            for (int c = 0; c < ic; ++c, ++witer)
                out->at(witer) = math::interpolate
                    (val[0][c], val[1][c], val[2][c], val[3][c],
                    0.25f, 0.25f, 0.25f, 0.25f);
        }
    }

    return out;
}